

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O1

char * mm_typecode_to_str(char *matcode)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char buffer [1025];
  char acStack_418 [1040];
  
  if (matcode[1] == 'C') {
    pcVar2 = "coordinate";
  }
  else {
    if (matcode[1] != 'A') {
      return (char *)0x0;
    }
    pcVar2 = "array";
  }
  bVar1 = matcode[2];
  if (bVar1 < 0x50) {
    if (bVar1 == 0x43) {
      pcVar3 = "complex";
    }
    else {
      if (bVar1 != 0x49) {
        return (char *)0x0;
      }
      pcVar3 = "integer";
    }
  }
  else if (bVar1 == 0x50) {
    pcVar3 = "pattern";
  }
  else {
    if (bVar1 != 0x52) {
      return (char *)0x0;
    }
    pcVar3 = "real";
  }
  bVar1 = matcode[3];
  if (bVar1 < 0x4b) {
    if (bVar1 == 0x47) {
      pcVar4 = "general";
    }
    else {
      if (bVar1 != 0x48) {
        return (char *)0x0;
      }
      pcVar4 = "hermitian";
    }
  }
  else if (bVar1 == 0x4b) {
    pcVar4 = "skew-symmetric";
  }
  else {
    if (bVar1 != 0x53) {
      return (char *)0x0;
    }
    pcVar4 = "symmetric";
  }
  sprintf(acStack_418,"%s %s %s %s","matrix",pcVar2,pcVar3,pcVar4);
  pcVar2 = mm_strdup(acStack_418);
  return pcVar2;
}

Assistant:

char *mm_typecode_to_str(MM_typecode matcode) {
    char buffer[MM_MAX_LINE_LENGTH];
    char *types[4];
    char *mm_strdup(const char *);
    int error = 0;

    /* check for MTX type */
    if (mm_is_matrix(matcode))
        types[0] = MM_MTX_STR;
    else
        error = 1;

    /* check for CRD or ARR matrix */
    if (mm_is_sparse(matcode))
        types[1] = MM_SPARSE_STR;
    else if (mm_is_dense(matcode))
        types[1] = MM_DENSE_STR;
    else
        return NULL;

    /* check for element data type */
    if (mm_is_real(matcode))
        types[2] = MM_REAL_STR;
    else if (mm_is_complex(matcode))
        types[2] = MM_COMPLEX_STR;
    else if (mm_is_pattern(matcode))
        types[2] = MM_PATTERN_STR;
    else if (mm_is_integer(matcode))
        types[2] = MM_INT_STR;
    else
        return NULL;


    /* check for symmetry type */
    if (mm_is_general(matcode))
        types[3] = MM_GENERAL_STR;
    else if (mm_is_symmetric(matcode))
        types[3] = MM_SYMM_STR;
    else if (mm_is_hermitian(matcode))
        types[3] = MM_HERM_STR;
    else if (mm_is_skew(matcode))
        types[3] = MM_SKEW_STR;
    else
        return NULL;

    sprintf(buffer, "%s %s %s %s", types[0], types[1], types[2], types[3]);
    return mm_strdup(buffer);

}